

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

LPVOID MapViewOfFile(HANDLE hFileMappingObject,DWORD dwDesiredAccess,DWORD dwFileOffsetHigh,
                    DWORD dwFileOffsetLow,SIZE_T dwNumberOfBytesToMap)

{
  LPVOID local_40;
  LPVOID pvMappedBaseAddress;
  CPalThread *pThread;
  SIZE_T SStack_28;
  PAL_ERROR palError;
  SIZE_T dwNumberOfBytesToMap_local;
  DWORD local_18;
  DWORD dwFileOffsetLow_local;
  DWORD dwFileOffsetHigh_local;
  DWORD dwDesiredAccess_local;
  HANDLE hFileMappingObject_local;
  
  pThread._4_4_ = 0;
  pvMappedBaseAddress = (LPVOID)0x0;
  local_40 = (LPVOID)0x0;
  SStack_28 = dwNumberOfBytesToMap;
  dwNumberOfBytesToMap_local._4_4_ = dwFileOffsetLow;
  local_18 = dwFileOffsetHigh;
  dwFileOffsetLow_local = dwDesiredAccess;
  _dwFileOffsetHigh_local = hFileMappingObject;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pvMappedBaseAddress = CorUnix::InternalGetCurrentThread();
  pThread._4_4_ =
       CorUnix::InternalMapViewOfFile
                 ((CPalThread *)pvMappedBaseAddress,_dwFileOffsetHigh_local,dwFileOffsetLow_local,
                  local_18,dwNumberOfBytesToMap_local._4_4_,SStack_28,&local_40);
  if (pThread._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(pThread._4_4_);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_40;
}

Assistant:

LPVOID
PALAPI
MapViewOfFile(
          IN HANDLE hFileMappingObject,
          IN DWORD dwDesiredAccess,
          IN DWORD dwFileOffsetHigh,
          IN DWORD dwFileOffsetLow,
          IN SIZE_T dwNumberOfBytesToMap)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread = NULL;
    LPVOID pvMappedBaseAddress = NULL;

    PERF_ENTRY(MapViewOfFile);
    ENTRY("MapViewOfFile(hFileMapping=%p, dwDesiredAccess=%u, "
          "dwFileOffsetH=%u, dwFileOffsetL=%u, dwNumberOfBytes=%u)\n",
          hFileMappingObject, dwDesiredAccess, dwFileOffsetHigh,
          dwFileOffsetLow, dwNumberOfBytesToMap);

    pThread = InternalGetCurrentThread();

    palError = InternalMapViewOfFile(
        pThread,
        hFileMappingObject,
        dwDesiredAccess,
        dwFileOffsetHigh,
        dwFileOffsetLow,
        dwNumberOfBytesToMap,
        &pvMappedBaseAddress
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT( "MapViewOfFile returning %p.\n", pvMappedBaseAddress );
    PERF_EXIT(MapViewOfFile);
    return pvMappedBaseAddress;
}